

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits_container_tests.cpp
# Opt level: O2

bool anon_unknown.dwarf_48993f4::ns::operator==
               (Project<std::set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
                *lhs,Project<std::set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
                     *rhs)

{
  __type_conflict1 _Var1;
  bool bVar2;
  
  if (lhs->version == rhs->version) {
    _Var1 = std::operator==(&lhs->name,&rhs->name);
    if (_Var1) {
      _Var1 = std::operator==(&lhs->author,&rhs->author);
      if (_Var1) {
        _Var1 = std::operator==(&lhs->notes,&rhs->notes);
        if ((_Var1) && (lhs->showNotes == rhs->showNotes)) {
          bVar2 = std::operator==(&(lhs->values)._M_t,&(rhs->values)._M_t);
          return bVar2;
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const Project& lhs, const Project& rhs)
        {
            return (lhs.version == rhs.version && 
                lhs.name == rhs.name &&
                lhs.author == rhs.author &&
                lhs.notes == rhs.notes &&
                lhs.showNotes == rhs.showNotes &&
                lhs.values == rhs.values);
        }